

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

bool __thiscall cornerstone::raft_server::is_leader(raft_server *this)

{
  bool bVar1;
  size_type sVar2;
  pointer prVar3;
  element_type *this_00;
  type this_01;
  int iVar4;
  long in_RDI;
  value_type *peer;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
  *__range2;
  vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  peer_resp_times;
  shared_lock<std::shared_timed_mutex> rlock;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int32 iVar5;
  shared_lock<std::shared_timed_mutex> *in_stack_ffffffffffffff30;
  __normal_iterator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_*,_std::vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_*,_std::vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  in_stack_ffffffffffffff40;
  duration<long,_std::ratio<1L,_1000L>_> local_80;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_78;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_70;
  reference local_58;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_50;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_48;
  long local_40;
  vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  local_38 [2];
  byte local_1;
  
  std::shared_lock<std::shared_timed_mutex>::shared_lock
            (in_stack_ffffffffffffff30,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if ((*(int *)(in_RDI + 0x128) == 3) &&
     (sVar2 = std::
              unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
              ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                      *)0x1c0c63), iVar5 = is_leader::time_elasped_since_quorum_resp, sVar2 != 0)) {
    std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
              ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
               0x1c0c85);
    prVar3 = std::
             unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>::
             operator->((unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                         *)0x1c0c91);
    iVar4 = prVar3->election_timeout_upper_bound_ * 2;
    if (iVar5 != iVar4 &&
        SBORROW4(iVar5,iVar4) == iVar5 + prVar3->election_timeout_upper_bound_ * -2 < 0) {
      std::
      vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ::vector((vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                *)0x1c0cb1);
      local_40 = in_RDI + 0x80;
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
           ::begin((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
           ::end((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      while (bVar1 = std::__detail::operator!=(&local_48,&local_50), bVar1) {
        local_58 = std::__detail::
                   _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                   ::operator*((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                                *)0x1c0d19);
        this_00 = std::
                  __shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1c0d32);
        cornerstone::peer::get_last_resp(this_00);
        std::
        vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
        ::push_back((vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     *)in_stack_ffffffffffffff40._M_current,in_stack_ffffffffffffff38._M_current);
        std::__detail::
        _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
        ::operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                      *)in_stack_ffffffffffffff30);
      }
      local_70 = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)std::
                    vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                    ::begin((vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_78 = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)std::
                    vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                    ::end((vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::
      sort<__gnu_cxx::__normal_iterator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>*,std::vector<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::chrono::_V2::system_clock::now();
      sVar2 = std::
              unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
              ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                      *)0x1c0de2);
      std::
      vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ::operator[](local_38,sVar2 >> 1);
      this_01 = std::chrono::operator-
                          (in_stack_ffffffffffffff38._M_current,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_ffffffffffffff30);
      local_80.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      in_stack_ffffffffffffff30 =
           (shared_lock<std::shared_timed_mutex> *)
           std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_80);
      is_leader::time_elasped_since_quorum_resp = (int32)in_stack_ffffffffffffff30;
      iVar5 = is_leader::time_elasped_since_quorum_resp;
      std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
                ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                 0x1c0e62);
      prVar3 = std::
               unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
               ::operator->((unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                             *)0x1c0e6e);
      iVar4 = prVar3->election_timeout_upper_bound_ * 2;
      bVar1 = SBORROW4(iVar5,iVar4) == iVar5 + prVar3->election_timeout_upper_bound_ * -2 < 0;
      if (iVar5 != iVar4 && bVar1) {
        local_1 = 0;
      }
      std::
      vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ::~vector((vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                 *)this_01.__r);
      if (iVar5 != iVar4 && bVar1) goto LAB_001c0ed0;
    }
  }
  local_1 = *(int *)(in_RDI + 0x128) == 3;
LAB_001c0ed0:
  std::shared_lock<std::shared_timed_mutex>::~shared_lock(in_stack_ffffffffffffff30);
  return (bool)(local_1 & 1);
}

Assistant:

bool raft_server::is_leader() const
{
    static volatile int32 time_elasped_since_quorum_resp(std::numeric_limits<int32>::max());
    read_lock(peers_lock_);
    if (role_ == srv_role::leader && peers_.size() > 0 &&
        time_elasped_since_quorum_resp > ctx_->params_->election_timeout_upper_bound_ * 2)
    {
        std::vector<time_point> peer_resp_times;
        for (auto& peer : peers_)
        {
            peer_resp_times.push_back(peer.second->get_last_resp());
        }

        std::sort(peer_resp_times.begin(), peer_resp_times.end());
        time_elasped_since_quorum_resp =
            static_cast<int32>(std::chrono::duration_cast<std::chrono::milliseconds>(
                                   system_clock::now() - peer_resp_times[peers_.size() / 2])
                                   .count());
        if (time_elasped_since_quorum_resp > ctx_->params_->election_timeout_upper_bound_ * 2)
        {
            return false;
        }
    }

    return role_ == srv_role::leader;
}